

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * fts5ApiGetAuxdata(Fts5Context *pCtx,int bClear)

{
  long *plVar1;
  void *pvVar2;
  Fts5Context *pFVar3;
  
  pFVar3 = pCtx + 0x98;
  while( true ) {
    plVar1 = *(long **)pFVar3;
    if (plVar1 == (long *)0x0) {
      return (void *)0x0;
    }
    if (*plVar1 == *(long *)(pCtx + 0x90)) break;
    pFVar3 = (Fts5Context *)(plVar1 + 3);
  }
  pvVar2 = (void *)plVar1[1];
  if (bClear == 0) {
    return pvVar2;
  }
  plVar1[1] = 0;
  plVar1[2] = 0;
  return pvVar2;
}

Assistant:

static void *fts5ApiGetAuxdata(Fts5Context *pCtx, int bClear){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Auxdata *pData;
  void *pRet = 0;

  for(pData=pCsr->pAuxdata; pData; pData=pData->pNext){
    if( pData->pAux==pCsr->pAux ) break;
  }

  if( pData ){
    pRet = pData->pPtr;
    if( bClear ){
      pData->pPtr = 0;
      pData->xDelete = 0;
    }
  }

  return pRet;
}